

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regenc.c
# Opt level: O0

int onigenc_minimum_property_name_to_ctype(OnigEncoding enc,OnigUChar *p,OnigUChar *end)

{
  int iVar1;
  int iVar2;
  PosixBracketEntryType *pPStack_30;
  int len;
  PosixBracketEntryType *pb;
  OnigUChar *end_local;
  OnigUChar *p_local;
  OnigEncoding enc_local;
  
  iVar1 = onigenc_strlen(enc,p,end);
  pPStack_30 = onigenc_minimum_property_name_to_ctype::PBS;
  while( true ) {
    if (pPStack_30->name == (OnigUChar *)0x0) {
      return -0xdf;
    }
    if ((iVar1 == pPStack_30->len) &&
       (iVar2 = onigenc_with_ascii_strncmp(enc,p,end,pPStack_30->name,(int)pPStack_30->len),
       iVar2 == 0)) break;
    pPStack_30 = pPStack_30 + 1;
  }
  return pPStack_30->ctype;
}

Assistant:

extern int
onigenc_minimum_property_name_to_ctype(OnigEncoding enc, UChar* p, UChar* end)
{
  static PosixBracketEntryType PBS[] = {
    { (UChar* )"Alnum",  ONIGENC_CTYPE_ALNUM,  5 },
    { (UChar* )"Alpha",  ONIGENC_CTYPE_ALPHA,  5 },
    { (UChar* )"Blank",  ONIGENC_CTYPE_BLANK,  5 },
    { (UChar* )"Cntrl",  ONIGENC_CTYPE_CNTRL,  5 },
    { (UChar* )"Digit",  ONIGENC_CTYPE_DIGIT,  5 },
    { (UChar* )"Graph",  ONIGENC_CTYPE_GRAPH,  5 },
    { (UChar* )"Lower",  ONIGENC_CTYPE_LOWER,  5 },
    { (UChar* )"Print",  ONIGENC_CTYPE_PRINT,  5 },
    { (UChar* )"Punct",  ONIGENC_CTYPE_PUNCT,  5 },
    { (UChar* )"Space",  ONIGENC_CTYPE_SPACE,  5 },
    { (UChar* )"Upper",  ONIGENC_CTYPE_UPPER,  5 },
    { (UChar* )"XDigit", ONIGENC_CTYPE_XDIGIT, 6 },
    { (UChar* )"ASCII",  ONIGENC_CTYPE_ASCII,  5 },
    { (UChar* )"Word",   ONIGENC_CTYPE_WORD,   4 },
    { (UChar* )NULL, -1, 0 }
  };

  PosixBracketEntryType *pb;
  int len;

  len = onigenc_strlen(enc, p, end);
  for (pb = PBS; IS_NOT_NULL(pb->name); pb++) {
    if (len == pb->len &&
        onigenc_with_ascii_strncmp(enc, p, end, pb->name, pb->len) == 0)
      return pb->ctype;
  }

  return ONIGERR_INVALID_CHAR_PROPERTY_NAME;
}